

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-attack.c
# Opt level: O3

wchar_t choose_attack_spell(bitflag *f,_Bool innate,_Bool non_innate)

{
  _Bool _Var1;
  long lVar2;
  wchar_t index;
  uint32_t uVar3;
  uint8_t spells [92];
  byte local_98 [104];
  
  local_98[0x50] = 0;
  local_98[0x51] = 0;
  local_98[0x52] = 0;
  local_98[0x53] = 0;
  local_98[0x54] = 0;
  local_98[0x55] = 0;
  local_98[0x56] = 0;
  local_98[0x57] = 0;
  local_98[0x58] = 0;
  local_98[0x59] = 0;
  local_98[0x5a] = 0;
  local_98[0x5b] = 0;
  local_98[0x40] = 0;
  local_98[0x41] = 0;
  local_98[0x42] = 0;
  local_98[0x43] = 0;
  local_98[0x44] = 0;
  local_98[0x45] = 0;
  local_98[0x46] = 0;
  local_98[0x47] = 0;
  local_98[0x48] = 0;
  local_98[0x49] = 0;
  local_98[0x4a] = 0;
  local_98[0x4b] = 0;
  local_98[0x4c] = 0;
  local_98[0x4d] = 0;
  local_98[0x4e] = 0;
  local_98[0x4f] = 0;
  local_98[0x30] = 0;
  local_98[0x31] = 0;
  local_98[0x32] = 0;
  local_98[0x33] = 0;
  local_98[0x34] = 0;
  local_98[0x35] = 0;
  local_98[0x36] = 0;
  local_98[0x37] = 0;
  local_98[0x38] = 0;
  local_98[0x39] = 0;
  local_98[0x3a] = 0;
  local_98[0x3b] = 0;
  local_98[0x3c] = 0;
  local_98[0x3d] = 0;
  local_98[0x3e] = 0;
  local_98[0x3f] = 0;
  local_98[0x20] = 0;
  local_98[0x21] = 0;
  local_98[0x22] = 0;
  local_98[0x23] = 0;
  local_98[0x24] = 0;
  local_98[0x25] = 0;
  local_98[0x26] = 0;
  local_98[0x27] = 0;
  local_98[0x28] = 0;
  local_98[0x29] = 0;
  local_98[0x2a] = 0;
  local_98[0x2b] = 0;
  local_98[0x2c] = 0;
  local_98[0x2d] = 0;
  local_98[0x2e] = 0;
  local_98[0x2f] = 0;
  local_98[0x10] = 0;
  local_98[0x11] = 0;
  local_98[0x12] = 0;
  local_98[0x13] = 0;
  local_98[0x14] = 0;
  local_98[0x15] = 0;
  local_98[0x16] = 0;
  local_98[0x17] = 0;
  local_98[0x18] = 0;
  local_98[0x19] = 0;
  local_98[0x1a] = 0;
  local_98[0x1b] = 0;
  local_98[0x1c] = 0;
  local_98[0x1d] = 0;
  local_98[0x1e] = 0;
  local_98[0x1f] = 0;
  local_98[0] = 0;
  local_98[1] = 0;
  local_98[2] = 0;
  local_98[3] = 0;
  local_98[4] = 0;
  local_98[5] = 0;
  local_98[6] = 0;
  local_98[7] = 0;
  local_98[8] = 0;
  local_98[9] = 0;
  local_98[10] = 0;
  local_98[0xb] = 0;
  local_98[0xc] = 0;
  local_98[0xd] = 0;
  local_98[0xe] = 0;
  local_98[0xf] = 0;
  uVar3 = 0;
  index = L'\x01';
  do {
    if (innate) {
LAB_0016471e:
      if (!non_innate) {
        _Var1 = mon_spell_is_innate(index);
        if (!_Var1) goto LAB_00164756;
      }
      _Var1 = flag_has_dbg(f,0xc,index,"f","i");
      if (_Var1) {
        lVar2 = (long)(int)uVar3;
        uVar3 = uVar3 + 1;
        local_98[lVar2] = (byte)index;
      }
    }
    else {
      _Var1 = mon_spell_is_innate(index);
      if (!_Var1) goto LAB_0016471e;
    }
LAB_00164756:
    index = index + L'\x01';
    if (index == L'\\') {
      uVar3 = Rand_div(uVar3);
      return (wchar_t)local_98[(int)uVar3];
    }
  } while( true );
}

Assistant:

int choose_attack_spell(bitflag *f, bool innate, bool non_innate)
{
	int num = 0;
	uint8_t spells[RSF_MAX];

	int i;

	/* Paranoid initialization */
	for (i = 0; i < RSF_MAX; i++) {
		spells[i] = 0;
	}

	/* Extract spells, filtering as necessary */
	for (i = FLAG_START, num = 0; i < RSF_MAX; i++) {
		if (!innate && mon_spell_is_innate(i)) continue;
		if (!non_innate && !mon_spell_is_innate(i)) continue;
		if (rsf_has(f, i)) spells[num++] = i;
	}

	/* Pick at random */
	return (spells[randint0(num)]);
}